

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O0

int __thiscall
ProgramStreamDemuxer::simpleDemuxBlock
          (ProgramStreamDemuxer *this,DemuxedData *demuxedData,PIDSet *acceptedPIDs,
          int64_t *discardSize)

{
  long lVar1;
  PESPacket *pPVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  uint16_t uVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  mapped_type *pmVar9;
  mapped_type *this_00;
  uint8_t *puVar10;
  size_t num;
  VodCoreException *this_01;
  long local_2f0;
  int local_2d4;
  uint32_t local_28c;
  int64_t rest;
  int psmLen;
  int tmpLen;
  ostringstream local_238 [8];
  ostringstream ss;
  int copyLen_1;
  int pesPayloadLen;
  uint8_t *payloadData;
  int idx;
  StreamData *vect_1;
  _Self local_98;
  long local_90;
  int64_t curPts;
  _Self local_80;
  int local_78;
  uint local_74;
  int afterPesHeader;
  int startcode;
  PESPacket *pesPacket;
  uint8_t *prevBuf;
  StreamData *vect;
  PESPacket *pPStack_50;
  int copyLen;
  uint8_t *curBuf;
  uint8_t *end;
  uint8_t *data;
  int readRez;
  uint32_t readedBytes;
  int64_t *discardSize_local;
  PIDSet *acceptedPIDs_local;
  DemuxedData *demuxedData_local;
  ProgramStreamDemuxer *this_local;
  
  *discardSize = 0;
  data._4_4_ = 0;
  data._0_4_ = 0;
  _readRez = discardSize;
  discardSize_local = (int64_t *)acceptedPIDs;
  acceptedPIDs_local = (PIDSet *)demuxedData;
  demuxedData_local = (DemuxedData *)this;
  iVar7 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(long)&data + 4,&data,0);
  end = (uint8_t *)CONCAT44(extraout_var,iVar7);
  if ((int)data == 2) {
    this->m_lastReadRez = 2;
    this_local._4_4_ = 2;
  }
  else if ((data._4_4_ + this->m_tmpBufferLen == 0) ||
          ((data._4_4_ == 0 && (this->m_lastReadRez == 1)))) {
    this->m_lastReadRez = (int)data;
    this_local._4_4_ = 1;
  }
  else {
    if (data._4_4_ != 0) {
      (*this->m_bufferedReader->_vptr_AbstractReader[5])
                (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(ulong)data._4_4_);
    }
    this->m_lastReadRez = (int)data;
    end = end + 0x3fa;
    if (0x3fa < this->m_tmpBufferLen) {
      __assert_fail("m_tmpBufferLen <= MAX_PES_HEADER_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/programStreamDemuxer.cpp"
                    ,0xda,
                    "virtual int ProgramStreamDemuxer::simpleDemuxBlock(DemuxedData &, const PIDSet &, int64_t &)"
                   );
    }
    if (this->m_tmpBufferLen != 0) {
      memcpy(end + -(ulong)this->m_tmpBufferLen,this->m_tmpBuffer,(ulong)this->m_tmpBufferLen);
      end = end + -(ulong)this->m_tmpBufferLen;
      data._4_4_ = this->m_tmpBufferLen + data._4_4_;
      this->m_tmpBufferLen = 0;
    }
    curBuf = end + data._4_4_;
    pPStack_50 = (PESPacket *)end;
    if (this->m_lastPesLen != 0) {
      if (this->m_lastPesLen < data._4_4_) {
        local_28c = this->m_lastPesLen;
      }
      else {
        local_28c = data._4_4_;
      }
      vect._4_4_ = local_28c;
      if (this->m_lastPID < 1) {
        *_readRez = (long)(int)local_28c + *_readRez;
      }
      else {
        prevBuf = (uint8_t *)
                  std::
                  map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                  ::operator[]((map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                                *)acceptedPIDs_local,&this->m_lastPID);
        MemoryBlock::append((MemoryBlock *)prevBuf,&pPStack_50->startCode0,(long)(int)vect._4_4_);
        this->m_dataProcessed = (long)(int)vect._4_4_ + this->m_dataProcessed;
      }
      pPStack_50 = (PESPacket *)(&pPStack_50->startCode0 + (int)vect._4_4_);
      this->m_lastPesLen = this->m_lastPesLen - vect._4_4_;
      if (this->m_lastPesLen != 0) {
        if (data._4_4_ != 0) {
          return 0;
        }
        return 1;
      }
    }
    pesPacket = pPStack_50;
    pPStack_50 = (PESPacket *)MPEGHeader::findNextMarker(&pPStack_50->startCode0,curBuf);
    *_readRez = (int64_t)((long)pPStack_50 + (*_readRez - (long)pesPacket));
    while (pPVar2 = pPStack_50, pPStack_50 <= (PESPacket *)(curBuf + -9)) {
      _afterPesHeader = pPStack_50;
      local_74 = (uint)pPStack_50->m_streamID;
      if ((((local_74 < 0xc0) || (0xef < local_74)) && (local_74 != 0xbd)) &&
         ((local_74 != 0xfd && (local_74 != 0xbf)))) {
        if (local_74 == 0xbc) {
          iVar7 = mpegps_psm_parse(this,&pPStack_50->startCode0,curBuf);
          if (iVar7 == -1) break;
          if ((long)curBuf - (long)pPStack_50 < (long)iVar7) {
            *_readRez = (int64_t)(curBuf + (*_readRez - (long)pPStack_50));
            this->m_lastPID = 0;
            this->m_lastPesLen = iVar7 - ((int)curBuf - (int)pPStack_50);
            return 0;
          }
          *_readRez = (long)iVar7 + *_readRez;
          pPStack_50 = (PESPacket *)(&pPStack_50->startCode0 + iVar7);
        }
        else {
          if ((long)curBuf - (long)pPStack_50 < 5) {
            local_2f0 = (long)curBuf - (long)pPStack_50;
          }
          else {
            local_2f0 = 4;
          }
          pPStack_50 = (PESPacket *)(&pPStack_50->startCode0 + local_2f0);
          *_readRez = local_2f0 + *_readRez;
        }
      }
      else {
        bVar3 = PESPacket::getHeaderLength(pPStack_50);
        if (curBuf < &pPVar2->m_pesPacketLenHi + (int)(uint)bVar3) break;
        local_78 = 0;
        local_74 = processPES(this,&pPStack_50->startCode0,curBuf,&local_78);
        local_80._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::find
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)discardSize_local,
                        (key_type_conflict *)&local_74);
        curPts = (int64_t)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                     discardSize_local);
        bVar4 = std::operator!=(&local_80,(_Self *)&curPts);
        if (bVar4) {
          if ((_afterPesHeader->flagsLo & 0x80) == 0x80) {
            local_90 = PESPacket::getPts(_afterPesHeader);
            if ((this->m_firstPTS == -1) || (local_90 < this->m_firstPTS)) {
              this->m_firstPTS = local_90;
            }
            bVar4 = isVideoPID(this,local_74);
            if ((bVar4) && ((this->m_firstVideoPTS == -1 || (local_90 < this->m_firstVideoPTS)))) {
              this->m_firstVideoPTS = local_90;
            }
            local_98._M_node =
                 (_Base_ptr)
                 std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::
                 find(&this->m_firstPtsTime,(key_type_conflict *)&local_74);
            vect_1 = (StreamData *)
                     std::
                     map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::
                     end(&this->m_firstPtsTime);
            bVar5 = std::operator==(&local_98,(_Self *)&vect_1);
            lVar1 = local_90;
            bVar4 = true;
            if (!bVar5) {
              pmVar9 = std::
                       map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                       ::operator[](&this->m_firstPtsTime,(key_type_conflict *)&local_74);
              bVar4 = lVar1 < *pmVar9;
            }
            lVar1 = local_90;
            if (bVar4) {
              pmVar9 = std::
                       map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                       ::operator[](&this->m_firstPtsTime,(key_type_conflict *)&local_74);
              *pmVar9 = lVar1;
            }
          }
          this_00 = std::
                    map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                    ::operator[]((map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                                  *)acceptedPIDs_local,(key_type_conflict *)&local_74);
          iVar7 = local_74 - 0xa0;
          if (((-1 < iVar7) && (iVar7 < 0x10)) && ((this->m_lpcpHeaderAdded[iVar7] & 1U) == 0)) {
            puVar10 = MemoryBlock::data(this->m_lpcmWaveHeader + iVar7);
            num = MemoryBlock::size(this->m_lpcmWaveHeader + iVar7);
            MemoryBlock::append(this_00,puVar10,num);
            this->m_lpcpHeaderAdded[iVar7] = true;
          }
          pPVar2 = pPStack_50;
          bVar3 = PESPacket::getHeaderLength(_afterPesHeader);
          puVar10 = &pPVar2->startCode0 + (long)local_78 + (long)(int)(uint)bVar3;
          uVar6 = PESPacket::getPacketLength(_afterPesHeader);
          bVar3 = PESPacket::getHeaderLength(_afterPesHeader);
          iVar7 = ((uint)uVar6 - (uint)bVar3) - local_78;
          local_2d4 = iVar7;
          if ((int)curBuf - (int)puVar10 < iVar7) {
            local_2d4 = (int)curBuf - (int)puVar10;
          }
          if (local_2d4 < 0) {
            std::__cxx11::ostringstream::ostringstream(local_238);
            std::operator<<((ostream *)local_238,"Invalid copyLen");
            this_01 = (VodCoreException *)__cxa_allocate_exception(0x28);
            std::__cxx11::ostringstream::str();
            VodCoreException::VodCoreException(this_01,3,(string *)&tmpLen);
            __cxa_throw(this_01,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          MemoryBlock::append(this_00,puVar10,(long)local_2d4);
          this->m_dataProcessed = (long)local_2d4 + this->m_dataProcessed;
          *_readRez = (int64_t)(puVar10 + (*_readRez - (long)pPStack_50));
          if (local_2d4 < iVar7) {
            this->m_lastPesLen = iVar7 - local_2d4;
            this->m_lastPID = local_74;
            return 0;
          }
          uVar6 = PESPacket::getPacketLength(_afterPesHeader);
          pPStack_50 = (PESPacket *)(&pPStack_50->startCode0 + (int)(uint)uVar6);
        }
        else {
          uVar6 = PESPacket::getPacketLength(_afterPesHeader);
          uVar8 = (uint)uVar6;
          if ((long)curBuf - (long)pPStack_50 < (long)(int)uVar8) {
            *_readRez = (int64_t)(curBuf + (*_readRez - (long)pPStack_50));
            this->m_lastPID = 0;
            this->m_lastPesLen = uVar8 - ((int)curBuf - (int)pPStack_50);
            return 0;
          }
          pPStack_50 = (PESPacket *)(&pPStack_50->startCode0 + (int)uVar8);
          *_readRez = (long)(int)uVar8 + *_readRez;
        }
      }
      pesPacket = pPStack_50;
      pPStack_50 = (PESPacket *)MPEGHeader::findNextMarker(&pPStack_50->startCode0,curBuf);
      *_readRez = (int64_t)((long)pPStack_50 + (*_readRez - (long)pesPacket));
    }
    this->m_tmpBufferLen = (int)curBuf - (int)pPStack_50;
    if (this->m_tmpBufferLen != 0) {
      memmove(this->m_tmpBuffer,pPStack_50,(long)curBuf - (long)pPStack_50);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ProgramStreamDemuxer::simpleDemuxBlock(DemuxedData& demuxedData, const PIDSet& acceptedPIDs, int64_t& discardSize)
{
    discardSize = 0;
    uint32_t readedBytes = 0;
    int readRez = 0;
    uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez);  // blocked read mode
    if (readRez == BufferedFileReader::DATA_NOT_READY)
    {
        m_lastReadRez = readRez;
        return BufferedFileReader::DATA_NOT_READY;
    }
    if (readedBytes + m_tmpBufferLen == 0 || (readedBytes == 0 && m_lastReadRez == BufferedReader::DATA_EOF))
    {
        m_lastReadRez = readRez;
        return BufferedReader::DATA_EOF;
    }
    if (readedBytes > 0)
        m_bufferedReader->notify(m_readerID, readedBytes);

    m_lastReadRez = readRez;
    data += MAX_PES_HEADER_SIZE;
    assert(m_tmpBufferLen <= MAX_PES_HEADER_SIZE);
    if (m_tmpBufferLen > 0)
    {
        memcpy(data - m_tmpBufferLen, m_tmpBuffer, m_tmpBufferLen);
        data -= m_tmpBufferLen;
        readedBytes += m_tmpBufferLen;
        m_tmpBufferLen = 0;
    }

    uint8_t* end = data + readedBytes;
    uint8_t* curBuf = data;

    if (m_lastPesLen > 0)
    {
        const int copyLen = FFMIN(readedBytes, m_lastPesLen);
        if (m_lastPID > 0)
        {
            StreamData& vect = demuxedData[m_lastPID];
            vect.append(curBuf, copyLen);
            m_dataProcessed += copyLen;
        }
        else
            discardSize += copyLen;
        curBuf += copyLen;
        m_lastPesLen -= copyLen;
        if (m_lastPesLen > 0)
        {
            if (readedBytes > 0)
                return 0;
            return BufferedReader::DATA_EOF;
        }
    }

    const uint8_t* prevBuf = curBuf;
    curBuf = MPEGHeader::findNextMarker(curBuf, end);
    discardSize += curBuf - prevBuf;

    while (curBuf <= end - 9)
    {
        const auto pesPacket = reinterpret_cast<PESPacket*>(curBuf);
        int startcode = curBuf[3];
        if ((startcode >= 0xc0 && startcode <= 0xef) || (startcode == PES_PRIVATE_DATA1) || (startcode == PES_VC1_ID) ||
            (startcode == PES_PRIVATE_DATA2))
        {
            if (curBuf + pesPacket->getHeaderLength() + 4 > end)
                break;
            int afterPesHeader = 0;
            startcode = processPES(curBuf, end, afterPesHeader);
            if (acceptedPIDs.find(startcode) != acceptedPIDs.end())
            {
                if ((pesPacket->flagsLo & 0x80) == 0x80)
                {
                    const int64_t curPts = pesPacket->getPts();
                    if (m_firstPTS == -1 || curPts < m_firstPTS)
                        m_firstPTS = curPts;
                    if (isVideoPID(startcode) && (m_firstVideoPTS == -1 || curPts < m_firstVideoPTS))
                        m_firstVideoPTS = curPts;
                    if (m_firstPtsTime.find(startcode) == m_firstPtsTime.end() || curPts < m_firstPtsTime[startcode])
                        m_firstPtsTime[startcode] = curPts;
                }

                StreamData& vect = demuxedData[startcode];

                const int idx = startcode - 0xa0;
                if (idx >= 0 && idx <= 15 && !m_lpcpHeaderAdded[idx])
                {
                    vect.append(m_lpcmWaveHeader[idx].data(), m_lpcmWaveHeader[idx].size());
                    m_lpcpHeaderAdded[idx] = true;
                }

                const uint8_t* payloadData = curBuf + pesPacket->getHeaderLength() + afterPesHeader;
                const int pesPayloadLen = pesPacket->getPacketLength() - pesPacket->getHeaderLength() - afterPesHeader;
                const int copyLen = FFMIN(pesPayloadLen, (int)(end - payloadData));
                if (copyLen < 0)
                {
                    THROW(ERR_COMMON, "Invalid copyLen")
                }
                vect.append(payloadData, copyLen);
                m_dataProcessed += copyLen;
                discardSize += payloadData - curBuf;
                if (copyLen < pesPayloadLen)
                {
                    m_lastPesLen = pesPayloadLen - copyLen;
                    m_lastPID = startcode;
                    return 0;
                }
                curBuf += pesPacket->getPacketLength();
            }
            else
            {
                const int tmpLen = pesPacket->getPacketLength();
                if (tmpLen > end - curBuf)
                {
                    discardSize += end - curBuf;
                    m_lastPID = 0;
                    m_lastPesLen = tmpLen - static_cast<int>(end - curBuf);
                    return 0;
                }
                curBuf += tmpLen;
                discardSize += tmpLen;
            }
        }
        else if (startcode == PES_PROGRAM_STREAM_MAP)
        {
            const int psmLen = mpegps_psm_parse(curBuf, end);
            if (psmLen == -1)
                break;
            if (psmLen > end - curBuf)
            {
                discardSize += end - curBuf;
                m_lastPID = 0;
                m_lastPesLen = psmLen - static_cast<int>(end - curBuf);
                return 0;
            }
            discardSize += psmLen;
            curBuf += psmLen;
        }
        else
        {
            const int64_t rest = FFMIN(end - curBuf, 4);
            curBuf += rest;
            discardSize += rest;
        }
        prevBuf = curBuf;
        curBuf = MPEGHeader::findNextMarker(curBuf, end);
        discardSize += curBuf - prevBuf;
    }
    m_tmpBufferLen = static_cast<uint32_t>(end - curBuf);
    if (m_tmpBufferLen > 0)
        memmove(m_tmpBuffer, curBuf, end - curBuf);
    return 0;
}